

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::LoadFloatConstant(VirtualMachine *this)

{
  element_type *peVar1;
  element_type *peVar2;
  size_t __n;
  const_reference pvVar3;
  string local_40;
  allocator<char> local_19;
  
  __n = getByteCodeParameter(this);
  peVar1 = (this->file).super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (__n < (ulong)((long)(peVar1->floatConstants).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(peVar1->floatConstants).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3)) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::at(&peVar1->floatConstants,__n);
    pushFloat(this,*pvVar3);
    peVar2 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar2->programCounter = peVar2->programCounter + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Index out of bounds in LoadFloatConstant",&local_19);
  panic(this,&local_40);
}

Assistant:

void runtime::VirtualMachine::LoadFloatConstant() {
  std::size_t index = this->getByteCodeParameter();

  if (index >= this->file->floatConstants.size()) {
    this->panic("Index out of bounds in LoadFloatConstant");
    return;
  }

  this->pushFloat(this->file->floatConstants.at(index));

  this->advance();
}